

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

void a__GlPrintError(char *message,GLenum error)

{
  char *pcVar1;
  
  switch(error) {
  case 0x500:
    pcVar1 = "GL_INVALID_ENUM";
    break;
  case 0x501:
    pcVar1 = "GL_INVALID_VALUE";
    break;
  case 0x502:
    pcVar1 = "GL_INVALID_OPERATION";
    break;
  case 0x503:
    pcVar1 = "GL_STACK_OVERFLOW";
    break;
  case 0x504:
    pcVar1 = "GL_STACK_UNDERFLOW";
    break;
  case 0x505:
    pcVar1 = "GL_OUT_OF_MEMORY";
    break;
  default:
    if (error == 0x8031) {
      pcVar1 = "GL_TABLE_TOO_LARGE";
    }
    else {
      pcVar1 = "UNKNOWN";
    }
  }
  aAppDebugPrintf("[agl] %s %s (%#x)",message,pcVar1);
  return;
}

Assistant:

static void a__GlPrintError(const char *message, GLenum error) {
	const char *errstr = "UNKNOWN";
	switch (error) {
	case GL_INVALID_ENUM: errstr = "GL_INVALID_ENUM"; break;
	case GL_INVALID_VALUE: errstr = "GL_INVALID_VALUE"; break;
	case GL_INVALID_OPERATION: errstr = "GL_INVALID_OPERATION"; break;
	#ifdef GL_STACK_OVERFLOW
	case GL_STACK_OVERFLOW: errstr = "GL_STACK_OVERFLOW"; break;
	#endif
	#ifdef GL_STACK_UNDERFLOW
	case GL_STACK_UNDERFLOW: errstr = "GL_STACK_UNDERFLOW"; break;
	#endif
	case GL_OUT_OF_MEMORY: errstr = "GL_OUT_OF_MEMORY"; break;
	#ifdef GL_TABLE_TOO_LARGE
	case GL_TABLE_TOO_LARGE: errstr = "GL_TABLE_TOO_LARGE"; break;
	#endif
	};
	AGL_PRINTFLN("%s %s (%#x)", message, errstr, error);
}